

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<std::__cxx11::string,char[13]>
          (string *__return_storage_ptr__,tinyformat *this,string *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [13])

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_1a8 [376];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  format<std::__cxx11::string,char[13]>
            ((ostream *)aoStack_1a8,*(char **)this,fmt,(char (*) [13])args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const std::string &fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt.c_str(), args...);
    return oss.str();
}